

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall
glslang::HlslGrammar::acceptMemberFunctionDefinition
          (HlslGrammar *this,TIntermNode **nodeList,TType *type,TString *memberName,
          TFunctionDeclarator *declarator)

{
  undefined4 uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  TPoolAllocator *pTVar5;
  TFunction *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TQualifier *qualifier;
  TVector<glslang::HlslToken> *tokens;
  TString *functionName;
  TString *local_38;
  
  local_38 = memberName;
  HlslParseContext::getFullNamespaceName(this->parseContext,&local_38);
  pTVar5 = GetThreadPoolAllocator();
  this_00 = (TFunction *)TPoolAllocator::allocate(pTVar5,0x160);
  TFunction::TFunction(this_00,local_38,type,EOpNull);
  declarator->function = this_00;
  iVar4 = (*type->_vptr_TType[0xb])(type);
  (*(declarator->function->super_TSymbol)._vptr_TSymbol
    [(ulong)((*(byte *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) != 0) * 2 + 0x20])();
  bVar3 = acceptFunctionParameters(this,declarator->function);
  if (bVar3) {
    iVar4 = (*(declarator->function->super_TSymbol)._vptr_TSymbol[0xd])();
    qualifier = (TQualifier *)
                (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x50))
                          ((long *)CONCAT44(extraout_var_00,iVar4));
    acceptPostDecls(this,qualifier);
    bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
    if (bVar3) {
      uVar1 = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      (declarator->loc).column = (this->super_HlslTokenStream).token.loc.column;
      *(undefined4 *)&(declarator->loc).field_0x14 = uVar1;
      iVar4 = (this->super_HlslTokenStream).token.loc.string;
      iVar2 = (this->super_HlslTokenStream).token.loc.line;
      (declarator->loc).name = (this->super_HlslTokenStream).token.loc.name;
      (declarator->loc).string = iVar4;
      (declarator->loc).line = iVar2;
      pTVar5 = GetThreadPoolAllocator();
      tokens = (TVector<glslang::HlslToken> *)TPoolAllocator::allocate(pTVar5,0x20);
      (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
      super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
      super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
      (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
      super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
      super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
      super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar5 = GetThreadPoolAllocator();
      (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
      super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
      super__Tp_alloc_type.allocator = pTVar5;
      (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
      super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
      super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
      super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      declarator->body = tokens;
      HlslParseContext::handleFunctionDeclarator
                (this->parseContext,&declarator->loc,declarator->function,false);
      bVar3 = captureBlockTokens(this,tokens);
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,&(this->super_HlslTokenStream).token,"Expected",
               "function parameter list","");
  }
  return bVar3;
}

Assistant:

bool HlslGrammar::acceptMemberFunctionDefinition(TIntermNode*& nodeList, const TType& type, TString& memberName,
                                                 TFunctionDeclarator& declarator)
{
    bool accepted = false;

    TString* functionName = &memberName;
    parseContext.getFullNamespaceName(functionName);
    declarator.function = new TFunction(functionName, type);
    if (type.getQualifier().storage == EvqTemporary)
        declarator.function->setImplicitThis();
    else
        declarator.function->setIllegalImplicitThis();

    // function_parameters
    if (acceptFunctionParameters(*declarator.function)) {
        // post_decls
        acceptPostDecls(declarator.function->getWritableType().getQualifier());

        // compound_statement (function body definition)
        if (peekTokenClass(EHTokLeftBrace)) {
            declarator.loc = token.loc;
            declarator.body = new TVector<HlslToken>;
            accepted = acceptFunctionDefinition(declarator, nodeList, declarator.body);
        }
    } else
        expected("function parameter list");

    return accepted;
}